

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

DisasJumpType op_vfma(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t bofs;
  uint32_t cofs;
  code *local_38;
  gen_helper_gvec_4_ptr_conflict12 *fn;
  _Bool se;
  uint8_t fpf;
  uint8_t m5;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = get_field1(s,FLD_O_m5,FLD_C_d1);
  iVar2 = get_field1(s,FLD_O_m6,FLD_C_d2);
  uVar3 = extract32(uVar1 & 0xff,3,1);
  if (((char)iVar2 == '\x03') && (uVar4 = extract32(uVar1 & 0xff,0,3), uVar4 == 0)) {
    if ((*(uint *)&(s->fields).field_0x8 >> 8 & 0xff) == 0x8f) {
      local_38 = gen_helper_gvec_vfma64;
      if (uVar3 != 0) {
        local_38 = gen_helper_gvec_vfma64s;
      }
    }
    else {
      local_38 = gen_helper_gvec_vfms64;
      if (uVar3 != 0) {
        local_38 = gen_helper_gvec_vfms64s;
      }
    }
    iVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
    uVar3 = vec_full_reg_offset((uint8_t)iVar2);
    iVar2 = get_field1(s,FLD_O_v2,FLD_C_d4);
    uVar4 = vec_full_reg_offset((uint8_t)iVar2);
    iVar2 = get_field1(s,FLD_O_v3,FLD_C_i3);
    bofs = vec_full_reg_offset((uint8_t)iVar2);
    iVar2 = get_field1(s,FLD_O_v4,FLD_C_b4);
    cofs = vec_full_reg_offset((uint8_t)iVar2);
    tcg_gen_gvec_4_ptr_s390x
              (tcg_ctx_00,uVar3,uVar4,bofs,cofs,tcg_ctx_00->cpu_env,0x10,0x10,0,local_38);
    s_local._4_4_ = DISAS_NEXT;
  }
  else {
    gen_program_exception(s,6);
    s_local._4_4_ = DISAS_NORETURN;
  }
  return s_local._4_4_;
}

Assistant:

static DisasJumpType op_vfma(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t m5 = get_field(s, m5);
    const uint8_t fpf = get_field(s, m6);
    const bool se = extract32(m5, 3, 1);
    gen_helper_gvec_4_ptr *fn;

    if (fpf != FPF_LONG || extract32(m5, 0, 3)) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    if (s->fields.op2 == 0x8f) {
        fn = se ? gen_helper_gvec_vfma64s : gen_helper_gvec_vfma64;
    } else {
        fn = se ? gen_helper_gvec_vfms64s : gen_helper_gvec_vfms64;
    }
    gen_gvec_4_ptr(tcg_ctx, get_field(s, v1), get_field(s, v2),
                   get_field(s, v3), get_field(s, v4), tcg_ctx->cpu_env,
                   0, fn);
    return DISAS_NEXT;
}